

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::to_map(Tree *this,size_t node,csubstr key,type_bits more_flags)

{
  code *pcVar1;
  csubstr s;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  NodeData *pNVar5;
  Tree *in_RDX;
  undefined8 in_RSI;
  size_t in_RDI;
  char msg_1 [60];
  char msg [37];
  size_t in_stack_fffffffffffffe28;
  Tree *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  Location *in_stack_fffffffffffffe50;
  Location *this_00;
  Tree *in_stack_fffffffffffffe80;
  Location in_stack_fffffffffffffe90;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  Location local_118;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  char *local_b0;
  undefined1 local_a8 [56];
  undefined8 local_70;
  Tree *local_60;
  Tree *pTStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  char *local_30;
  undefined8 local_28;
  size_t local_18;
  NodeData *local_8;
  
  local_70 = in_RSI;
  local_60 = in_RDX;
  bVar2 = has_children(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if (bVar2) {
    memcpy(local_a8,"check failed: (! has_children(node))",0x25);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       (size_t)in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe28 = CONCAT44(uStack_cc,local_d0);
    in_stack_fffffffffffffe30 = (Tree *)CONCAT44(uStack_c4,uStack_c8);
    (*pcVar1)(local_a8,0x25,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe38 = local_c0;
    in_stack_fffffffffffffe3c = uStack_bc;
    in_stack_fffffffffffffe40 = uStack_b8;
    in_stack_fffffffffffffe44 = uStack_b4;
    in_stack_fffffffffffffe48 = local_b0;
  }
  sVar4 = parent(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if (sVar4 != 0xffffffffffffffff) {
    local_28 = local_70;
    bVar2 = has_parent(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    if (!bVar2) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location((Location *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                         (size_t)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe38 = (undefined4)local_40;
      in_stack_fffffffffffffe3c = (undefined4)((ulong)local_40 >> 0x20);
      in_stack_fffffffffffffe40 = (undefined4)uStack_38;
      in_stack_fffffffffffffe44 = (undefined4)((ulong)uStack_38 >> 0x20);
      error<31ul>((char (*) [31])in_stack_fffffffffffffe80,in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe30 = pTStack_48;
      in_stack_fffffffffffffe48 = local_30;
    }
    pNVar5 = _p(in_stack_fffffffffffffe80,in_RDI);
    local_18 = pNVar5->m_parent;
    local_8 = _p(in_stack_fffffffffffffe80,in_RDI);
    if (((local_8->m_type).type & MAP) == NOTYPE) {
      memcpy(&local_118,"check failed: (parent(node) == NONE || parent_is_map(node))",0x3c);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = *(code **)(in_RDI + 0x58);
      this_00 = &local_118;
      Location::Location(this_00,in_stack_fffffffffffffe48,
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                         (size_t)in_stack_fffffffffffffe30);
      in_stack_fffffffffffffe30 = (Tree *)CONCAT44(uStack_134,uStack_138);
      (*pcVar1)(this_00,0x3c,*(undefined8 *)(in_RDI + 0x40));
      in_stack_fffffffffffffe38 = local_130;
      in_stack_fffffffffffffe3c = uStack_12c;
      in_stack_fffffffffffffe40 = uStack_128;
      in_stack_fffffffffffffe44 = uStack_124;
    }
  }
  _set_flags((Tree *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             (type_bits)in_stack_fffffffffffffe30);
  s.str._4_4_ = in_stack_fffffffffffffe3c;
  s.str._0_4_ = in_stack_fffffffffffffe38;
  s.len._0_4_ = in_stack_fffffffffffffe40;
  s.len._4_4_ = in_stack_fffffffffffffe44;
  NodeScalar::NodeScalar((NodeScalar *)in_stack_fffffffffffffe30,s);
  pNVar5 = _p(local_60,in_RDI);
  memcpy(&pNVar5->m_key,&stack0xfffffffffffffe90,0x30);
  _p(local_60,in_RDI);
  NodeScalar::clear((NodeScalar *)in_stack_fffffffffffffe30);
  return;
}

Assistant:

void Tree::to_map(size_t node, csubstr key, type_bits more_flags)
{
    _RYML_CB_ASSERT(m_callbacks,  ! has_children(node));
    _RYML_CB_ASSERT(m_callbacks, parent(node) == NONE || parent_is_map(node));
    _set_flags(node, KEY|MAP|more_flags);
    _p(node)->m_key = key;
    _p(node)->m_val.clear();
}